

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O3

XMLContentModel * __thiscall xercesc_4_0::DTDElementDecl::createChildModel(DTDElementDecl *this)

{
  undefined4 uVar1;
  MemoryManager *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  SimpleContentModel *this_00;
  DFAContentModel *this_01;
  undefined4 extraout_var_00;
  XMLContentModel *pXVar5;
  QName *pQVar6;
  QName *pQVar7;
  RuntimeException *this_02;
  long lVar4;
  
  iVar3 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 == 0) {
    this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_02,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
               ,0x118,CM_UnknownCMSpecType,(this->super_XMLElementDecl).fMemoryManager);
  }
  else {
    if ((*(long *)(lVar4 + 0x10) == 0) || (*(int *)(*(long *)(lVar4 + 0x10) + 0x20) != -1)) {
      iVar3 = *(int *)(lVar4 + 0x30);
      if (iVar3 - 1U < 3) {
        if (*(int *)(*(long *)(lVar4 + 0x20) + 0x30) == 0) {
          pXVar5 = (XMLContentModel *)
                   XMemory::operator_new(0x28,(this->super_XMLElementDecl).fMemoryManager);
          pQVar7 = *(QName **)(*(long *)(lVar4 + 0x20) + 0x10);
          uVar1 = *(undefined4 *)(lVar4 + 0x30);
          pMVar2 = (this->super_XMLElementDecl).fMemoryManager;
          pXVar5->_vptr_XMLContentModel = (_func_int **)&PTR__SimpleContentModel_0040e010;
          pXVar5[1]._vptr_XMLContentModel = (_func_int **)0x0;
          pXVar5[2]._vptr_XMLContentModel = (_func_int **)0x0;
          *(undefined4 *)&pXVar5[3]._vptr_XMLContentModel = uVar1;
          *(undefined1 *)((long)&pXVar5[3]._vptr_XMLContentModel + 4) = 1;
          pXVar5[4]._vptr_XMLContentModel = (_func_int **)pMVar2;
          pQVar6 = (QName *)XMemory::operator_new(0x48,pMVar2);
          if (pQVar7 == (QName *)0x0) {
            QName::QName(pQVar6,L"",L"",0xfffffffe,pMVar2);
          }
          else {
            QName::QName(pQVar6,pQVar7);
          }
          pXVar5[1]._vptr_XMLContentModel = (_func_int **)pQVar6;
          pQVar7 = (QName *)XMemory::operator_new(0x48,pMVar2);
          QName::QName(pQVar7,L"",L"",0xfffffffe,pMVar2);
          goto LAB_002fe6a4;
        }
      }
      else {
        if (1 < iVar3 - 4U) {
          if (iVar3 != 0) {
            this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
            RuntimeException::RuntimeException
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
                       ,0x15e,CM_UnknownCMSpecType,(this->super_XMLElementDecl).fMemoryManager);
            goto LAB_002fe73c;
          }
          pXVar5 = (XMLContentModel *)
                   XMemory::operator_new(0x28,(this->super_XMLElementDecl).fMemoryManager);
          pQVar7 = *(QName **)(lVar4 + 0x10);
          pMVar2 = (this->super_XMLElementDecl).fMemoryManager;
          pXVar5->_vptr_XMLContentModel = (_func_int **)&PTR__SimpleContentModel_0040e010;
          pXVar5[1]._vptr_XMLContentModel = (_func_int **)0x0;
          pXVar5[2]._vptr_XMLContentModel = (_func_int **)0x0;
          *(undefined4 *)&pXVar5[3]._vptr_XMLContentModel = 0;
          *(undefined1 *)((long)&pXVar5[3]._vptr_XMLContentModel + 4) = 1;
          pXVar5[4]._vptr_XMLContentModel = (_func_int **)pMVar2;
          pQVar6 = (QName *)XMemory::operator_new(0x48,pMVar2);
          if (pQVar7 == (QName *)0x0) {
            QName::QName(pQVar6,L"",L"",0xfffffffe,pMVar2);
          }
          else {
            QName::QName(pQVar6,pQVar7);
          }
          pXVar5[1]._vptr_XMLContentModel = (_func_int **)pQVar6;
          pQVar7 = (QName *)XMemory::operator_new(0x48,pMVar2);
          QName::QName(pQVar7,L"",L"",0xfffffffe,pMVar2);
LAB_002fe6a4:
          pXVar5[2]._vptr_XMLContentModel = (_func_int **)pQVar7;
          return pXVar5;
        }
        if ((*(int *)(*(long *)(lVar4 + 0x20) + 0x30) == 0) &&
           (*(int *)(*(long *)(lVar4 + 0x28) + 0x30) == 0)) {
          this_00 = (SimpleContentModel *)
                    XMemory::operator_new(0x28,(this->super_XMLElementDecl).fMemoryManager);
          SimpleContentModel::SimpleContentModel
                    (this_00,true,*(QName **)(*(long *)(lVar4 + 0x20) + 0x10),
                     *(QName **)(*(long *)(lVar4 + 0x28) + 0x10),*(NodeTypes *)(lVar4 + 0x30),
                     (this->super_XMLElementDecl).fMemoryManager);
          return &this_00->super_XMLContentModel;
        }
      }
      this_01 = (DFAContentModel *)
                XMemory::operator_new(0x88,(this->super_XMLElementDecl).fMemoryManager);
      iVar3 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])(this);
      DFAContentModel::DFAContentModel
                (this_01,true,(ContentSpecNode *)CONCAT44(extraout_var_00,iVar3),
                 (this->super_XMLElementDecl).fMemoryManager);
      return &this_01->super_XMLContentModel;
    }
    this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_02,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
               ,0x120,CM_NoPCDATAHere,(this->super_XMLElementDecl).fMemoryManager);
  }
LAB_002fe73c:
  __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLContentModel* DTDElementDecl::createChildModel()
{
    // Get the content spec node of the element
    ContentSpecNode* specNode = getContentSpec();

    if(!specNode)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, getMemoryManager());

    //
    //  Do a sanity check that the node does not have a PCDATA id. Since,
    //  if it was, it should have already gotten taken by the Mixed model.
    //
    if (specNode->getElement()) {
        if (specNode->getElement()->getURI() == XMLElementDecl::fgPCDataElemId)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoPCDATAHere, getMemoryManager());
    }

    //
    //  According to the type of node, we will create the correct type of
    //  content model.
    //
    if (specNode->getType() == ContentSpecNode::Leaf)
    {
        // Create a simple content model
        return new (getMemoryManager()) SimpleContentModel
        (
            true
            , specNode->getElement()
            , 0
            , ContentSpecNode::Leaf
            , getMemoryManager()
        );
    }
     else if ((specNode->getType() == ContentSpecNode::Choice)
          ||  (specNode->getType() == ContentSpecNode::Sequence))
    {
        //
        //  Lets see if both of the children are leafs. If so, then it has to
        //  be a simple content model
        //
        if ((specNode->getFirst()->getType() == ContentSpecNode::Leaf)
        &&  (specNode->getSecond()->getType() == ContentSpecNode::Leaf))
        {
            return new (getMemoryManager()) SimpleContentModel
            (
                true
                , specNode->getFirst()->getElement()
                , specNode->getSecond()->getElement()
                , specNode->getType()
                , getMemoryManager()
            );
        }
    }
     else if ((specNode->getType() == ContentSpecNode::OneOrMore)
          ||  (specNode->getType() == ContentSpecNode::ZeroOrMore)
          ||  (specNode->getType() == ContentSpecNode::ZeroOrOne))
    {
        //
        //  Its a repetition, so see if its one child is a leaf. If so its a
        //  repetition of a single element, so we can do a simple content
        //  model for that.
        //
        if (specNode->getFirst()->getType() == ContentSpecNode::Leaf)
        {
            return new (getMemoryManager()) SimpleContentModel
            (
                true
                , specNode->getFirst()->getElement()
                , 0
                , specNode->getType()
                , getMemoryManager()
            );
        }
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, getMemoryManager());
    }

    // Its not any simple type of content, so create a DFA based content model
    return new (getMemoryManager()) DFAContentModel
    (
        true
        , this->getContentSpec()
        , getMemoryManager()
    );
}